

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::replaceLaneI8x16
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  undefined3 in_register_00000009;
  long lVar1;
  Type *this_00;
  undefined1 local_1a0 [8];
  LaneArray<16> lanes;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_1a0,(wasm *)this,other);
  if (index < 0x10) {
    this_00 = &lanes._M_elems[(ulong)CONCAT31(in_register_00000009,index) - 1].type;
    if ((Literal *)this_00 != other) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,other);
    }
    Literal(__return_storage_ptr__,(LaneArray<16> *)local_1a0);
    lVar1 = 0x168;
    do {
      ~Literal((Literal *)(local_1a0 + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("array::at: __n (which is %zu) >= _Nm (which is %zu)",
             (ulong)CONCAT31(in_register_00000009,index),0x10);
}

Assistant:

Literal Literal::replaceLaneI8x16(const Literal& other, uint8_t index) const {
  return replace<16, &Literal::getLanesUI8x16>(*this, other, index);
}